

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_HTMLtree(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  xmlOutputBufferPtr pxVar12;
  xmlDocPtr pxVar13;
  FILE *pFVar14;
  htmlDocPtr pxVar15;
  xmlChar *pxVar16;
  xmlBufferPtr pxVar17;
  xmlDocPtr pxVar18;
  char *pcVar19;
  ulong uVar20;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int nr;
  int nr_00;
  int nr_01;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int nr_02;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int nr_03;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int nr_04;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int nr_05;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  undefined8 uVar21;
  int iVar22;
  int iVar23;
  xmlDocPtr pxVar24;
  int test_ret_2;
  xmlDocPtr in_RSI;
  uint uVar25;
  uint uVar26;
  int n_cur;
  uint uVar27;
  undefined8 *puVar28;
  undefined8 *local_68;
  int local_5c;
  int test_ret_1;
  int test_ret;
  int local_44;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing HTMLtree : 18 of 18 functions ...");
  }
  local_5c = 0;
  for (uVar27 = 0; uVar27 != 2; uVar27 = uVar27 + 1) {
    uVar20 = 0;
    while (iVar22 = (int)uVar20, iVar22 != 4) {
      uVar11 = 0;
      while (uVar25 = (uint)uVar11, uVar25 != 4) {
        pxVar24 = (xmlDocPtr)0x0;
        while (iVar23 = (int)pxVar24, iVar23 != 4) {
          iVar2 = xmlMemBlocks();
          iVar3 = (int)in_RSI;
          pxVar12 = gen_xmlOutputBufferPtr(uVar27,iVar3);
          pxVar13 = gen_xmlDocPtr(iVar22,iVar3);
          if (uVar25 < 3) {
            uVar21 = (&DAT_0015bd68)[uVar11];
          }
          else {
            uVar21 = 0;
          }
          gen_int(iVar23,iVar3);
          in_RSI = pxVar13;
          htmlDocContentDumpFormatOutput(pxVar12,pxVar13,uVar21);
          call_tests = call_tests + 1;
          iVar3 = extraout_EDX;
          if (pxVar12 != (xmlOutputBufferPtr)0x0) {
            xmlOutputBufferClose(pxVar12);
            iVar3 = extraout_EDX_00;
          }
          des_xmlDocPtr((int)pxVar13,in_RSI,iVar3);
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlDocContentDumpFormatOutput",
                   (ulong)(uint)(iVar3 - iVar2));
            local_5c = local_5c + 1;
            printf(" %d",(ulong)uVar27);
            printf(" %d",uVar20);
            printf(" %d",uVar11);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar24;
          }
          pxVar24 = (xmlDocPtr)(ulong)(iVar23 + 1);
        }
        uVar11 = (ulong)(uVar25 + 1);
      }
      uVar20 = (ulong)(iVar22 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar22 = 0;
  for (uVar27 = 0; uVar27 != 2; uVar27 = uVar27 + 1) {
    uVar20 = 0;
    while (iVar23 = (int)uVar20, iVar23 != 4) {
      local_68 = &DAT_0015bd68;
      pxVar24 = (xmlDocPtr)0x0;
      while (uVar25 = (uint)pxVar24, uVar25 != 4) {
        iVar2 = xmlMemBlocks();
        iVar3 = (int)in_RSI;
        pxVar12 = gen_xmlOutputBufferPtr(uVar27,iVar3);
        pxVar13 = gen_xmlDocPtr(iVar23,iVar3);
        if (uVar25 < 3) {
          uVar21 = *local_68;
        }
        else {
          uVar21 = 0;
        }
        in_RSI = pxVar13;
        htmlDocContentDumpOutput(pxVar12,pxVar13,uVar21);
        call_tests = call_tests + 1;
        iVar3 = extraout_EDX_01;
        if (pxVar12 != (xmlOutputBufferPtr)0x0) {
          xmlOutputBufferClose(pxVar12);
          iVar3 = extraout_EDX_02;
        }
        des_xmlDocPtr((int)pxVar13,in_RSI,iVar3);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlDocContentDumpOutput",(ulong)(uint)(iVar3 - iVar2))
          ;
          iVar22 = iVar22 + 1;
          printf(" %d",(ulong)uVar27);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar24;
        }
        local_68 = local_68 + 1;
        pxVar24 = (xmlDocPtr)(ulong)(uVar25 + 1);
      }
      uVar20 = (ulong)(iVar23 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar23 = 0;
  for (uVar27 = 0; uVar27 != 2; uVar27 = uVar27 + 1) {
    pxVar24 = (xmlDocPtr)0x0;
    while (iVar2 = (int)pxVar24, iVar2 != 4) {
      iVar4 = xmlMemBlocks();
      iVar3 = (int)in_RSI;
      pFVar14 = (FILE *)gen_FILE_ptr(uVar27,iVar3);
      pxVar13 = gen_xmlDocPtr(iVar2,iVar3);
      in_RSI = pxVar13;
      htmlDocDump(pFVar14);
      call_tests = call_tests + 1;
      iVar3 = extraout_EDX_03;
      if (pFVar14 != (FILE *)0x0) {
        fclose(pFVar14);
        iVar3 = extraout_EDX_04;
      }
      des_xmlDocPtr((int)pxVar13,in_RSI,iVar3);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar4 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlDocDump",(ulong)(uint)(iVar3 - iVar4));
        iVar23 = iVar23 + 1;
        printf(" %d",(ulong)uVar27);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar24;
      }
      pxVar24 = (xmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar27 = 0; uVar27 != 4; uVar27 = uVar27 + 1) {
    bVar1 = true;
    while (bVar1) {
      pxVar24 = (xmlDocPtr)0x0;
      while (iVar3 = (int)pxVar24, iVar3 != 2) {
        iVar4 = xmlMemBlocks();
        pxVar13 = gen_xmlDocPtr(uVar27,(int)in_RSI);
        uVar21 = 0;
        if (iVar3 == 0) {
          uVar21 = 0x15e438;
        }
        in_RSI = (xmlDocPtr)0x0;
        htmlDocDumpMemory(pxVar13,0,uVar21);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar13,in_RSI,nr);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlDocDumpMemory",(ulong)(uint)(iVar5 - iVar4));
          iVar2 = iVar2 + 1;
          printf(" %d",(ulong)uVar27);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar24;
        }
        pxVar24 = (xmlDocPtr)(ulong)(iVar3 + 1);
      }
      bVar1 = false;
    }
  }
  iVar22 = iVar22 + local_5c;
  function_tests = function_tests + 1;
  iVar3 = 0;
  for (uVar27 = 0; uVar27 != 4; uVar27 = uVar27 + 1) {
    pxVar24 = (xmlDocPtr)0x1;
    while (pxVar24 != (xmlDocPtr)0x0) {
      for (iVar4 = 0; pxVar24 = (xmlDocPtr)0x0, iVar4 != 2; iVar4 = iVar4 + 1) {
        uVar21 = 0;
        if (iVar4 == 0) {
          uVar21 = 0x15e438;
        }
        while (iVar5 = (int)pxVar24, iVar5 != 4) {
          iVar6 = xmlMemBlocks();
          iVar7 = (int)in_RSI;
          pxVar13 = gen_xmlDocPtr(uVar27,iVar7);
          gen_int(iVar5,iVar7);
          in_RSI = (xmlDocPtr)0x0;
          htmlDocDumpMemoryFormat(pxVar13,0,uVar21);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar13,in_RSI,nr_00);
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlDocDumpMemoryFormat",(ulong)(uint)(iVar7 - iVar6)
                  );
            iVar3 = iVar3 + 1;
            printf(" %d",(ulong)uVar27);
            printf(" %d",0);
            printf(" %d",iVar4);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar24;
          }
          pxVar24 = (xmlDocPtr)(ulong)(iVar5 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_5c = 0;
  for (uVar27 = 0; uVar27 != 3; uVar27 = uVar27 + 1) {
    iVar4 = xmlMemBlocks();
    pxVar15 = gen_htmlDocPtr(uVar27,(int)in_RSI);
    htmlGetMetaEncoding(pxVar15);
    call_tests = call_tests + 1;
    des_htmlDocPtr((int)pxVar15,in_RSI,nr_01);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlGetMetaEncoding",(ulong)(uint)(iVar5 - iVar4));
      local_5c = local_5c + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar27;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (uVar27 = 0; uVar27 != 5; uVar27 = uVar27 + 1) {
    iVar5 = xmlMemBlocks();
    pxVar16 = gen_const_xmlChar_ptr(uVar27,(int)in_RSI);
    htmlIsBooleanAttr(pxVar16);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsBooleanAttr",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar27;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar27 = 0; uVar27 != 5; uVar27 = uVar27 + 1) {
    pxVar24 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar24;
      if (iVar7 == 5) break;
      iVar8 = xmlMemBlocks();
      pxVar16 = gen_const_xmlChar_ptr(uVar27,iVar6);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,iVar6);
      pxVar15 = (htmlDocPtr)htmlNewDoc(pxVar16);
      desret_htmlDocPtr(pxVar15);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar8 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewDoc",(ulong)(uint)(iVar6 - iVar8));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar27);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar24;
      }
      pxVar24 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar20 = 0;
  while (iVar7 = (int)uVar20, iVar7 != 5) {
    pxVar24 = (xmlDocPtr)0x0;
    while( true ) {
      iVar8 = (int)in_RSI;
      iVar10 = (int)pxVar24;
      if (iVar10 == 5) break;
      iVar9 = xmlMemBlocks();
      pxVar16 = gen_const_xmlChar_ptr(iVar7,iVar8);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar10,iVar8);
      pxVar15 = (htmlDocPtr)htmlNewDocNoDtD(pxVar16);
      desret_htmlDocPtr(pxVar15);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar9 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewDocNoDtD",(ulong)(uint)(iVar8 - iVar9));
        iVar6 = iVar6 + 1;
        printf(" %d",uVar20);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar24;
      }
      pxVar24 = (xmlDocPtr)(ulong)(iVar10 + 1);
    }
    uVar20 = (ulong)(iVar7 + 1);
  }
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar27 = 0; uVar27 != 3; uVar27 = uVar27 + 1) {
    for (uVar25 = 0; uVar25 != 4; uVar25 = uVar25 + 1) {
      pxVar24 = (xmlDocPtr)0x0;
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar8 = (int)pxVar24;
        if (iVar8 == 3) break;
        iVar10 = xmlMemBlocks();
        pxVar17 = gen_xmlBufferPtr(uVar27,iVar7);
        pxVar18 = gen_xmlDocPtr(uVar25,iVar7);
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar8,iVar7);
        pxVar13 = pxVar18;
        htmlNodeDump(pxVar17,pxVar18,in_RSI);
        call_tests = call_tests + 1;
        iVar7 = extraout_EDX_05;
        if (pxVar17 != (xmlBufferPtr)0x0) {
          xmlBufferFree(pxVar17);
          iVar7 = extraout_EDX_06;
        }
        des_xmlDocPtr((int)pxVar18,pxVar13,iVar7);
        des_xmlNodePtr(iVar8,(xmlNodePtr)in_RSI,nr_02);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar10 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlNodeDump",(ulong)(uint)(iVar7 - iVar10));
          local_40 = local_40 + 1;
          printf(" %d",(ulong)uVar27);
          printf(" %d",(ulong)uVar25);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar24;
        }
        pxVar24 = (xmlDocPtr)(ulong)(iVar8 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar20 = 0;
  while (iVar7 = (int)uVar20, iVar7 != 2) {
    for (uVar27 = 0; uVar27 != 4; uVar27 = uVar27 + 1) {
      pxVar24 = (xmlDocPtr)0x0;
      while( true ) {
        iVar8 = (int)in_RSI;
        iVar10 = (int)pxVar24;
        if (iVar10 == 3) break;
        iVar9 = xmlMemBlocks();
        pFVar14 = (FILE *)gen_FILE_ptr(iVar7,iVar8);
        pxVar18 = gen_xmlDocPtr(uVar27,iVar8);
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar10,iVar8);
        pxVar13 = pxVar18;
        htmlNodeDumpFile(pFVar14,pxVar18,in_RSI);
        call_tests = call_tests + 1;
        iVar8 = extraout_EDX_07;
        if (pFVar14 != (FILE *)0x0) {
          fclose(pFVar14);
          iVar8 = extraout_EDX_08;
        }
        des_xmlDocPtr((int)pxVar18,pxVar13,iVar8);
        des_xmlNodePtr(iVar10,(xmlNodePtr)in_RSI,nr_03);
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar9 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlNodeDumpFile",(ulong)(uint)(iVar8 - iVar9));
          local_44 = local_44 + 1;
          printf(" %d",uVar20);
          printf(" %d",(ulong)uVar27);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar24;
        }
        pxVar24 = (xmlDocPtr)(ulong)(iVar10 + 1);
      }
    }
    uVar20 = (ulong)(iVar7 + 1);
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar27 = 0; uVar27 != 2; uVar27 = uVar27 + 1) {
    for (uVar25 = 0; uVar25 != 4; uVar25 = uVar25 + 1) {
      for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
        uVar20 = 0;
        while (uVar26 = (uint)uVar20, uVar26 != 4) {
          pxVar24 = (xmlDocPtr)0x0;
          while( true ) {
            iVar10 = (int)in_RSI;
            iVar8 = (int)pxVar24;
            if (iVar8 == 4) break;
            iVar9 = xmlMemBlocks();
            pFVar14 = (FILE *)gen_FILE_ptr(uVar27,iVar10);
            pxVar13 = gen_xmlDocPtr(uVar25,iVar10);
            in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar10);
            if (uVar26 < 3) {
              uVar21 = (&DAT_0015bd68)[uVar20];
            }
            else {
              uVar21 = 0;
            }
            iVar10 = gen_int(iVar8,iVar10);
            pxVar18 = pxVar13;
            htmlNodeDumpFileFormat(pFVar14,pxVar13,in_RSI,uVar21,iVar10);
            call_tests = call_tests + 1;
            iVar10 = extraout_EDX_09;
            if (pFVar14 != (FILE *)0x0) {
              fclose(pFVar14);
              iVar10 = extraout_EDX_10;
            }
            des_xmlDocPtr((int)pxVar13,pxVar18,iVar10);
            des_xmlNodePtr(iVar7,(xmlNodePtr)in_RSI,nr_04);
            xmlResetLastError();
            iVar10 = xmlMemBlocks();
            if (iVar9 != iVar10) {
              iVar10 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlNodeDumpFileFormat",
                     (ulong)(uint)(iVar10 - iVar9));
              local_3c = local_3c + 1;
              printf(" %d",(ulong)uVar27);
              printf(" %d",(ulong)uVar25);
              printf(" %d",iVar7);
              printf(" %d",uVar20);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar24;
            }
            pxVar24 = (xmlDocPtr)(ulong)(iVar8 + 1);
          }
          uVar20 = (ulong)(uVar26 + 1);
        }
      }
    }
  }
  iVar22 = iVar22 + iVar23 + iVar2 + iVar3 + local_5c + iVar4 + iVar5 + iVar6 + local_40;
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar27 = 0; uVar27 != 2; uVar27 = uVar27 + 1) {
    for (uVar25 = 0; uVar25 != 4; uVar25 = uVar25 + 1) {
      for (iVar23 = 0; iVar23 != 3; iVar23 = iVar23 + 1) {
        uVar20 = 0;
        while (uVar26 = (uint)uVar20, uVar26 != 4) {
          pxVar24 = (xmlDocPtr)0x0;
          while( true ) {
            iVar3 = (int)in_RSI;
            iVar2 = (int)pxVar24;
            if (iVar2 == 4) break;
            iVar4 = xmlMemBlocks();
            pxVar12 = gen_xmlOutputBufferPtr(uVar27,iVar3);
            pxVar13 = gen_xmlDocPtr(uVar25,iVar3);
            in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar23,iVar3);
            if (uVar26 < 3) {
              uVar21 = (&DAT_0015bd68)[uVar20];
            }
            else {
              uVar21 = 0;
            }
            iVar3 = gen_int(iVar2,iVar3);
            pxVar18 = pxVar13;
            htmlNodeDumpFormatOutput(pxVar12,pxVar13,in_RSI,uVar21,iVar3);
            call_tests = call_tests + 1;
            iVar3 = extraout_EDX_11;
            if (pxVar12 != (xmlOutputBufferPtr)0x0) {
              xmlOutputBufferClose(pxVar12);
              iVar3 = extraout_EDX_12;
            }
            des_xmlDocPtr((int)pxVar13,pxVar18,iVar3);
            des_xmlNodePtr(iVar23,(xmlNodePtr)in_RSI,nr_05);
            xmlResetLastError();
            iVar3 = xmlMemBlocks();
            if (iVar4 != iVar3) {
              iVar3 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlNodeDumpFormatOutput",
                     (ulong)(uint)(iVar3 - iVar4));
              local_40 = local_40 + 1;
              printf(" %d",(ulong)uVar27);
              printf(" %d",(ulong)uVar25);
              printf(" %d",iVar23);
              printf(" %d",uVar20);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar24;
            }
            pxVar24 = (xmlDocPtr)(ulong)(iVar2 + 1);
          }
          uVar20 = (ulong)(uVar26 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar23 = 0;
  for (uVar27 = 0; uVar27 != 2; uVar27 = uVar27 + 1) {
    for (uVar25 = 0; uVar25 != 4; uVar25 = uVar25 + 1) {
      for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
        for (uVar26 = 0; iVar3 = (int)in_RSI, uVar26 != 4; uVar26 = uVar26 + 1) {
          iVar4 = xmlMemBlocks();
          pxVar12 = gen_xmlOutputBufferPtr(uVar27,iVar3);
          pxVar13 = gen_xmlDocPtr(uVar25,iVar3);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar3);
          pxVar24 = pxVar13;
          htmlNodeDumpOutput(pxVar12,pxVar13,in_RSI);
          call_tests = call_tests + 1;
          iVar3 = extraout_EDX_13;
          if (pxVar12 != (xmlOutputBufferPtr)0x0) {
            xmlOutputBufferClose(pxVar12);
            iVar3 = extraout_EDX_14;
          }
          des_xmlDocPtr((int)pxVar13,pxVar24,iVar3);
          des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_06);
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar4 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlNodeDumpOutput",(ulong)(uint)(iVar3 - iVar4));
            iVar23 = iVar23 + 1;
            printf(" %d",(ulong)uVar27);
            printf(" %d",(ulong)uVar25);
            printf(" %d",iVar2);
            in_RSI = (xmlDocPtr)(ulong)uVar26;
            printf(" %d");
            putchar(10);
          }
        }
      }
    }
  }
  iVar22 = iVar22 + local_44 + local_3c;
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar20 = 0;
  while (iVar2 = (int)uVar20, iVar2 != 6) {
    pxVar24 = (xmlDocPtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar4 = (int)pxVar24;
      if (iVar4 == 4) break;
      iVar5 = xmlMemBlocks();
      pcVar19 = gen_fileoutput(iVar2,iVar3);
      pxVar13 = gen_xmlDocPtr(iVar4,iVar3);
      in_RSI = pxVar13;
      htmlSaveFile(pcVar19);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar13,in_RSI,nr_07);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar5 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlSaveFile",(ulong)(uint)(iVar3 - iVar5));
        local_44 = local_44 + 1;
        printf(" %d",uVar20);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar24;
      }
      pxVar24 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
    uVar20 = (ulong)(iVar2 + 1);
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar27 = 0; uVar27 != 6; uVar27 = uVar27 + 1) {
    for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
      pxVar24 = (xmlDocPtr)0x0;
      puVar28 = &DAT_0015bd68;
      while( true ) {
        iVar3 = (int)in_RSI;
        uVar25 = (uint)pxVar24;
        if (uVar25 == 4) break;
        iVar4 = xmlMemBlocks();
        pcVar19 = gen_fileoutput(uVar27,iVar3);
        pxVar13 = gen_xmlDocPtr(iVar2,iVar3);
        if (uVar25 < 3) {
          uVar21 = *puVar28;
        }
        else {
          uVar21 = 0;
        }
        in_RSI = pxVar13;
        htmlSaveFileEnc(pcVar19,pxVar13,uVar21);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar13,in_RSI,nr_08);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar4 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlSaveFileEnc",(ulong)(uint)(iVar3 - iVar4));
          local_3c = local_3c + 1;
          printf(" %d",(ulong)uVar27);
          printf(" %d",iVar2);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar24;
        }
        pxVar24 = (xmlDocPtr)(ulong)(uVar25 + 1);
        puVar28 = puVar28 + 1;
      }
    }
  }
  function_tests = function_tests + 1;
  local_5c = 0;
  for (uVar27 = 0; uVar27 != 6; uVar27 = uVar27 + 1) {
    for (uVar25 = 0; uVar25 != 4; uVar25 = uVar25 + 1) {
      uVar20 = 0;
      while (uVar26 = (uint)uVar20, uVar26 != 4) {
        pxVar24 = (xmlDocPtr)0x0;
        while( true ) {
          iVar3 = (int)in_RSI;
          iVar2 = (int)pxVar24;
          if (iVar2 == 4) break;
          iVar4 = xmlMemBlocks();
          pcVar19 = gen_fileoutput(uVar27,iVar3);
          pxVar13 = gen_xmlDocPtr(uVar25,iVar3);
          if (uVar26 < 3) {
            uVar21 = (&DAT_0015bd68)[uVar20];
          }
          else {
            uVar21 = 0;
          }
          iVar3 = gen_int(iVar2,iVar3);
          in_RSI = pxVar13;
          htmlSaveFileFormat(pcVar19,pxVar13,uVar21,iVar3);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar13,in_RSI,nr_09);
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar4 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlSaveFileFormat",(ulong)(uint)(iVar3 - iVar4));
            local_5c = local_5c + 1;
            printf(" %d",(ulong)uVar27);
            printf(" %d",(ulong)uVar25);
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar24;
          }
          pxVar24 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar20 = (ulong)(uVar26 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar27 = 0; uVar27 != 3; uVar27 = uVar27 + 1) {
    pxVar24 = (xmlDocPtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar4 = (int)pxVar24;
      if (iVar4 == 5) break;
      iVar5 = xmlMemBlocks();
      pxVar15 = gen_htmlDocPtr(uVar27,iVar3);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar4,iVar3);
      htmlSetMetaEncoding(pxVar15);
      call_tests = call_tests + 1;
      des_htmlDocPtr((int)pxVar15,in_RSI,nr_10);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar5 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlSetMetaEncoding",(ulong)(uint)(iVar3 - iVar5));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar27);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar24;
      }
      pxVar24 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar27 = iVar22 + local_40 + iVar23 + local_44 + local_3c + local_5c + iVar2;
  if (uVar27 != 0) {
    printf("Module HTMLtree: %d errors\n",(ulong)uVar27);
  }
  return uVar27;
}

Assistant:

static int
test_HTMLtree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLtree : 18 of 18 functions ...\n");
    test_ret += test_htmlDocContentDumpFormatOutput();
    test_ret += test_htmlDocContentDumpOutput();
    test_ret += test_htmlDocDump();
    test_ret += test_htmlDocDumpMemory();
    test_ret += test_htmlDocDumpMemoryFormat();
    test_ret += test_htmlGetMetaEncoding();
    test_ret += test_htmlIsBooleanAttr();
    test_ret += test_htmlNewDoc();
    test_ret += test_htmlNewDocNoDtD();
    test_ret += test_htmlNodeDump();
    test_ret += test_htmlNodeDumpFile();
    test_ret += test_htmlNodeDumpFileFormat();
    test_ret += test_htmlNodeDumpFormatOutput();
    test_ret += test_htmlNodeDumpOutput();
    test_ret += test_htmlSaveFile();
    test_ret += test_htmlSaveFileEnc();
    test_ret += test_htmlSaveFileFormat();
    test_ret += test_htmlSetMetaEncoding();

    if (test_ret != 0)
	printf("Module HTMLtree: %d errors\n", test_ret);
    return(test_ret);
}